

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O1

int nni_lmq_resize(nni_lmq *lmq,size_t cap)

{
  ulong uVar1;
  nng_msg *pnVar2;
  int iVar3;
  ulong uVar4;
  nng_msg **ppnVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  
  uVar1 = 2;
  do {
    uVar4 = uVar1;
    uVar1 = uVar4 * 2;
  } while (uVar4 < cap);
  ppnVar5 = (nng_msg **)nni_alloc(uVar4 * 8);
  if (ppnVar5 == (nng_msg **)0x0) {
    iVar3 = 2;
  }
  else {
    if (cap == 0) {
      sVar8 = 0;
    }
    else {
      sVar6 = lmq->lmq_len;
      sVar7 = 0;
      do {
        sVar8 = sVar7;
        if (sVar6 == 0) break;
        sVar8 = lmq->lmq_get;
        uVar1 = sVar8 + 1;
        lmq->lmq_get = uVar1;
        pnVar2 = lmq->lmq_msgs[sVar8];
        lmq->lmq_get = uVar1 & lmq->lmq_mask;
        sVar6 = sVar6 - 1;
        lmq->lmq_len = sVar6;
        ppnVar5[sVar7] = pnVar2;
        sVar7 = sVar7 + 1;
        sVar8 = cap;
      } while (cap != sVar7);
    }
    nni_lmq_flush(lmq);
    if (lmq->lmq_alloc != 0) {
      nni_free(lmq->lmq_msgs,lmq->lmq_alloc << 3);
    }
    lmq->lmq_msgs = ppnVar5;
    lmq->lmq_cap = cap;
    lmq->lmq_alloc = uVar4;
    lmq->lmq_mask = uVar4 - 1;
    lmq->lmq_len = sVar8;
    lmq->lmq_put = sVar8;
    lmq->lmq_get = 0;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int
nni_lmq_resize(nni_lmq *lmq, size_t cap)
{
	nng_msg  *msg;
	nng_msg **new_q;
	size_t    alloc;
	size_t    len;

	alloc = 2;
	while (alloc < cap) {
		alloc *= 2;
	}

	if ((new_q = nni_alloc(sizeof(nng_msg *) * alloc)) == NULL) {
		return (NNG_ENOMEM);
	}

	len = 0;
	while ((len < cap) && (nni_lmq_get(lmq, &msg) == 0)) {
		new_q[len++] = msg;
	}

	// Flush anything left over.
	nni_lmq_flush(lmq);

	if (lmq->lmq_alloc > 0) {
		nni_free(lmq->lmq_msgs, lmq->lmq_alloc * sizeof(nng_msg *));
	}
	lmq->lmq_msgs  = new_q;
	lmq->lmq_cap   = cap;
	lmq->lmq_alloc = alloc;
	lmq->lmq_mask  = alloc - 1;
	lmq->lmq_len   = len;
	lmq->lmq_put   = len;
	lmq->lmq_get   = 0;

	return (0);
}